

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall
HModel::util_reportColVecSol
          (HModel *this,int ncol,vector<double,_std::allocator<double>_> *XcolCost,
          vector<double,_std::allocator<double>_> *XcolLower,
          vector<double,_std::allocator<double>_> *XcolUpper,
          vector<double,_std::allocator<double>_> *XcolPrimal,
          vector<double,_std::allocator<double>_> *XcolDual,
          vector<int,_std::allocator<int>_> *XcolStatus)

{
  double *pdVar1;
  double dVar2;
  char *__format;
  ulong uVar3;
  
  if (0 < ncol) {
    puts("Col    St      Primal       Lower       Upper        Dual        Cost");
    uVar3 = 0;
    do {
      switch((XcolStatus->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3]) {
      case 0:
        dVar2 = (XcolLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        pdVar1 = (XcolUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
        if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
          __format = "%6d LB";
        }
        else {
          __format = "%6d FX";
        }
        break;
      case 1:
        __format = "%6d BC";
        break;
      case 2:
        __format = "%6d UB";
        break;
      case 3:
        __format = "%6d FR";
        break;
      default:
        __format = "%6d ??";
      }
      printf(__format,uVar3 & 0xffffffff);
      printf(" %11g %11g %11g %11g %11g\n",
             (XcolPrimal->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XcolLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XcolUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XcolDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XcolCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)ncol != uVar3);
  }
  return;
}

Assistant:

void HModel::util_reportColVecSol(int ncol, vector<double>& XcolCost, vector<double>& XcolLower, vector<double>& XcolUpper,
			      vector<double>& XcolPrimal, vector<double>& XcolDual, vector<int>& XcolStatus) {
  // Report the LP column data and solution passed to the method,
  // where XcolStatus is the SCIP-like basis status
  if (ncol <= 0) return;
  printf("Col    St      Primal       Lower       Upper        Dual        Cost\n");
  for (int col = 0; col < ncol; col++) {
    if (XcolStatus[col] == HSOL_BASESTAT_BASIC)
      printf("%6d BC", col);
    else if (XcolStatus[col] == HSOL_BASESTAT_ZERO)
      printf("%6d FR", col);
    else if (XcolStatus[col] == HSOL_BASESTAT_LOWER) {
      if (XcolLower[col] == XcolUpper[col])
	printf("%6d FX", col);
      else
	printf("%6d LB", col);
    }
    else if (XcolStatus[col] == HSOL_BASESTAT_UPPER)
      printf("%6d UB", col);
    else
      printf("%6d ??", col);
    printf(" %11g %11g %11g %11g %11g\n", XcolPrimal[col], XcolLower[col], XcolUpper[col], XcolDual[col], XcolCost[col]);
  }
}